

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

_ElementType __thiscall
Lib::
CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
::next(CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>_>
       *this)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->_first == true) {
    bVar1 = 1;
    if ((this->_it1)._finished != true) goto LAB_0030d4f7;
    this->_first = false;
  }
  (*((this->_it2)._iter._core)->_vptr_IteratorCore[2])();
  bVar1 = this->_first;
LAB_0030d4f7:
  if ((bVar1 & 1) != 0) {
    (this->_it1)._finished = true;
    return (this->_it1)._el;
  }
  iVar2 = (*((this->_it2)._iter._core)->_vptr_IteratorCore[3])();
  return (_ElementType)CONCAT44(extraout_var,iVar2);
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }